

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::skip
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,Decoder *d)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  undefined4 extraout_var;
  _Elt_pointer pSVar4;
  unsigned_long n;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar5;
  long lVar6;
  stored_head_type sVar7;
  ostream *poVar8;
  Exception *pEVar9;
  string local_1e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  ProductionPtr pp;
  
  this_00 = &this->parsingStack;
  sVar2 = std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::size
                    (&this_00->c);
  if (sVar2 == 0) {
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pp,"Nothing to skip!",(allocator<char> *)&local_1e0);
    Exception::Exception(pEVar9,(string *)&pp);
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
LAB_001682ca:
  sVar3 = std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::size
                    (&this_00->c);
  if (sVar3 < sVar2) {
    return;
  }
  pSVar4 = (this->parsingStack).c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 == (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar4 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  switch(pSVar4[-1].kind_) {
  case sNull:
    (*d->_vptr_Decoder[3])(d);
    break;
  case sBool:
    (*d->_vptr_Decoder[4])(d);
    break;
  case sInt:
    (*d->_vptr_Decoder[5])(d);
    break;
  case sLong:
    (*d->_vptr_Decoder[6])(d);
    break;
  case sFloat:
    (*d->_vptr_Decoder[7])(d);
    break;
  case sDouble:
    (*d->_vptr_Decoder[8])(d);
    break;
  case sString:
    (*d->_vptr_Decoder[10])(d);
    break;
  case sBytes:
    (*d->_vptr_Decoder[0xc])(d);
    break;
  case sArrayStart:
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c)
    ;
    iVar1 = (*d->_vptr_Decoder[0x12])(d);
    sVar7 = CONCAT44(extraout_var_00,iVar1);
    pSVar4 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar4 == (this->parsingStack).c.
                  super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      pSVar4 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    assertMatch(sRepeater,pSVar4[-1].kind_);
    if (sVar7 != 0) {
LAB_0016840b:
      pSVar4 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar4 == (this->parsingStack).c.
                    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar4 = (this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      ptVar5 = boost::
               any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar4[-1].extra_);
      (ptVar5->super_type).head = sVar7;
      goto LAB_001682ca;
    }
    break;
  case sArrayEnd:
  case sMapEnd:
    break;
  case sMapStart:
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c)
    ;
    iVar1 = (*d->_vptr_Decoder[0x15])(d);
    sVar7 = CONCAT44(extraout_var,iVar1);
    if (sVar7 != 0) {
      pSVar4 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar4 == (this->parsingStack).c.
                    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar4 = (this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      assertMatch(sRepeater,pSVar4[-1].kind_);
      goto LAB_0016840b;
    }
    break;
  case sFixed:
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c)
    ;
    pSVar4 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar4 == (this->parsingStack).c.
                  super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      pSVar4 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    n = boost::any_cast<unsigned_long>(&pSVar4[-1].extra_);
    Decoder::decodeFixed((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0,d,n);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c0);
    break;
  case sEnum:
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c)
    ;
    (*d->_vptr_Decoder[0xf])(d);
    break;
  case sUnion:
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c)
    ;
    iVar1 = (*d->_vptr_Decoder[0x16])(d);
    selectBranch(this,CONCAT44(extraout_var_01,iVar1));
    goto LAB_001682ca;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp);
    poVar8 = std::operator<<((ostream *)&pp,"Don\'t know how to skip ");
    std::operator<<(poVar8,*(char **)(Symbol::stringValues + (ulong)pSVar4[-1].kind_ * 8));
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::stringbuf::str();
    Exception::Exception(pEVar9,&local_1e0);
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  case sRepeater:
    ptVar5 = boost::
             any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                       (&pSVar4[-1].extra_);
    sVar7 = (ptVar5->super_type).head;
    if (sVar7 == 0) {
      lVar6 = 0x88;
      if ((ptVar5->super_type).tail.head == false) {
        lVar6 = 0xa0;
      }
      sVar7 = (**(code **)((long)d->_vptr_Decoder + lVar6))(d);
      (ptVar5->super_type).head = sVar7;
      if (sVar7 == 0) break;
    }
    (ptVar5->super_type).head = sVar7 - 1;
    append(this,&(ptVar5->super_type).tail.tail.tail.head);
    goto LAB_001682ca;
  case sIndirect:
    boost::
    any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              ((boost *)&pp,&pSVar4[-1].extra_);
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c)
    ;
    append(this,&pp);
    boost::detail::shared_count::~shared_count(&pp.pn);
    goto LAB_001682ca;
  case sSymbolic:
    goto switchD_00168313_caseD_18;
  }
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c);
  goto LAB_001682ca;
switchD_00168313_caseD_18:
  boost::
  any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
            ((boost *)&local_1e0,&pSVar4[-1].extra_);
  boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
  shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
            ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>> *
             )&pp,(weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)&local_1e0);
  boost::detail::weak_count::~weak_count((weak_count *)&local_1e0._M_string_length);
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c);
  append(this,&pp);
  boost::detail::shared_count::~shared_count(&pp.pn);
  goto LAB_001682ca;
}

Assistant:

void skip(Decoder& d) {
        const size_t sz = parsingStack.size();
        if (sz == 0) {
            throw Exception("Nothing to skip!");
        }
        while (parsingStack.size() >= sz) {
            Symbol& t = parsingStack.top();
            switch (t.kind()) {
            case Symbol::sNull:
                d.decodeNull();
                break;
            case Symbol::sBool:
                d.decodeBool();
                break;
            case Symbol::sInt:
                d.decodeInt();
                break;
            case Symbol::sLong:
                d.decodeLong();
                break;
            case Symbol::sFloat:
                d.decodeFloat();
                break;
            case Symbol::sDouble:
                d.decodeDouble();
                break;
            case Symbol::sString:
                d.skipString();
                break;
            case Symbol::sBytes:
                d.skipBytes();
                break;
            case Symbol::sArrayStart:
                {
                    parsingStack.pop();
                    size_t n = d.skipArray();
                    assertMatch(Symbol::sRepeater, parsingStack.top().kind());
                    if (n == 0) {
                        break;
                    }
                    Symbol& t = parsingStack.top();
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    boost::tuples::get<0>(*p) = n;
                    continue;
                }
            case Symbol::sArrayEnd:
                break;
            case Symbol::sMapStart:
                {
                    parsingStack.pop();
                    size_t n = d.skipMap();
                    if (n == 0) {
                        break;
                    }
                    assertMatch(Symbol::sRepeater, parsingStack.top().kind());
                    Symbol& t = parsingStack.top();
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    boost::tuples::get<0>(*p) = n;
                    continue;
                }
            case Symbol::sMapEnd:
                break;
            case Symbol::sFixed:
                {
                    parsingStack.pop();
                    Symbol& t = parsingStack.top();
                    d.decodeFixed(t.extra<size_t>());
                }
                break;
            case Symbol::sEnum:
                parsingStack.pop();
                d.decodeEnum();
                break;
            case Symbol::sUnion:
                {
                    parsingStack.pop();
                    size_t n = d.decodeUnionIndex();
                    selectBranch(n);
                    continue;
                }
            case Symbol::sRepeater:
                {
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    if (boost::tuples::get<0>(*p) == 0) {
                        boost::tuples::get<0>(*p) =
                            boost::tuples::get<1>(*p) ? d.arrayNext() :
                                d.mapNext();
                    }
                    if (boost::tuples::get<0>(*p) != 0) {
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<3>(*p));
                        continue;
                    }
                }
                break;
            case Symbol::sIndirect:
                {
                    ProductionPtr pp =
                        t.extra<ProductionPtr>();
                    parsingStack.pop();
                    append(pp);
                }
                continue;
            case Symbol::sSymbolic:
                {
                    ProductionPtr pp(
                        t.extra<boost::weak_ptr<Production> >());
                    parsingStack.pop();
                    append(pp);
                }
                continue;
            default:
                {
                    std::ostringstream oss;
                    oss << "Don't know how to skip "
                        << Symbol::toString(t.kind());
                    throw Exception(oss.str());
                }
            }
            parsingStack.pop();
        }
    }